

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

bool __thiscall VmaMappingHysteresis::PostMap(VmaMappingHysteresis *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  bVar3 = this->m_ExtraMapping == 0;
  if (bVar3) {
    uVar2 = this->m_MajorCounter + 1;
    this->m_MajorCounter = uVar2;
    uVar1 = 0;
    if (uVar2 < 7) goto LAB_001c6f7e;
    this->m_MajorCounter = 0;
    this->m_ExtraMapping = 1;
  }
  else {
    uVar1 = this->m_MinorCounter;
    uVar2 = this->m_MajorCounter;
    if (uVar1 < uVar2) {
      uVar1 = uVar1 + 1;
    }
    else {
      if (uVar2 == 0) {
        return false;
      }
      this->m_MajorCounter = uVar2 - 1;
      uVar1 = uVar1 - 1;
    }
  }
  this->m_MinorCounter = uVar1;
  uVar1 = (uint)bVar3;
LAB_001c6f7e:
  return SUB41(uVar1,0);
}

Assistant:

bool PostMap()
    {
#if VMA_MAPPING_HYSTERESIS_ENABLED
        if(m_ExtraMapping == 0)
        {
            ++m_MajorCounter;
            if(m_MajorCounter >= COUNTER_MIN_EXTRA_MAPPING)
            {
                m_ExtraMapping = 1;
                m_MajorCounter = 0;
                m_MinorCounter = 0;
                return true;
            }
        }
        else // m_ExtraMapping == 1
            PostMinorCounter();
#endif // #if VMA_MAPPING_HYSTERESIS_ENABLED
        return false;
    }